

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plane3d.h
# Opt level: O2

EIntersectionRelation3D __thiscall
irr::core::plane3d<float>::classifyPointRelation(plane3d<float> *this,vector3d<float> *point)

{
  EIntersectionRelation3D EVar1;
  float fVar2;
  
  fVar2 = vector3d<float>::dotProduct(&this->Normal,point);
  fVar2 = fVar2 + this->D;
  EVar1 = ISREL3D_BACK;
  if (-1e-06 <= fVar2) {
    EVar1 = (uint)(fVar2 <= 1e-06) * 2;
  }
  return EVar1;
}

Assistant:

EIntersectionRelation3D classifyPointRelation(const vector3d<T> &point) const
	{
		const T d = Normal.dotProduct(point) + D;

		if (d < -ROUNDING_ERROR_f32)
			return ISREL3D_BACK;

		if (d > ROUNDING_ERROR_f32)
			return ISREL3D_FRONT;

		return ISREL3D_PLANAR;
	}